

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O1

void __thiscall cmXMLElement::cmXMLElement(cmXMLElement *this,cmXMLWriter *xml,char *tag)

{
  allocator<char> local_31;
  string local_30;
  
  this->xmlwr = xml;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,tag,&local_31);
  cmXMLWriter::StartElement(xml,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmXMLElement(cmXMLWriter& xml, const char* tag)
    : xmlwr(xml)
  {
    xmlwr.StartElement(tag);
  }